

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O1

ion_bpp_err_t b_update(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t rec)

{
  bool bVar1;
  int iVar2;
  ion_bpp_err_t iVar3;
  ion_bpp_address_t iVar4;
  ion_bpp_buffer_t *pbuf;
  int iVar5;
  ion_bpp_h_node_t *h;
  ion_bpp_key_t *mkey;
  ion_bpp_buffer_t *cbuf;
  ion_bpp_buffer_t *tmp [4];
  ion_bpp_err_t local_74;
  ion_bpp_key_t *local_70;
  void *local_68;
  ion_bpp_buffer_t *local_60;
  ion_bpp_buffer_t *local_58 [5];
  
  pbuf = (ion_bpp_buffer_t *)((long)handle + 0x20);
  if (*(int *)((long)handle + 0xb8) * 3 == (uint)(**(ushort **)((long)handle + 0x38) >> 1)) {
    memcpy(*(void **)((long)handle + 0x98),*(ushort **)((long)handle + 0x38),
           (long)*(int *)((long)handle + 0x10) * 3);
    **(ushort **)((long)handle + 0x98) =
         (ushort)*(undefined4 *)*(ushort **)((long)handle + 0x98) & 0xfffe |
         **(ushort **)((long)handle + 0x38) & 1;
    **(ushort **)((long)handle + 0x38) = **(ushort **)((long)handle + 0x38) & 1;
    local_74 = scatter(handle,pbuf,(ion_bpp_key_t *)(*(long *)((long)handle + 0x38) + 0x20),0,
                       local_58);
    if (local_74 != bErrOk) {
      return local_74;
    }
  }
  iVar5 = 0;
  local_68 = key;
  do {
    if ((undefined1  [40])((undefined1  [40])*pbuf->p & (undefined1  [40])0x1) !=
        (undefined1  [40])0x0) {
      if (maxHeight < iVar5) {
        maxHeight = iVar5;
      }
      iVar5 = search(handle,pbuf,key,rec,&local_70,MODE_MATCH);
      if (iVar5 == -1) {
        return bErrKeyNotFound;
      }
      if (iVar5 == 1) {
        return bErrKeyNotFound;
      }
      *(ion_bpp_external_address_t *)(local_70 + *(int *)((long)handle + 8)) = rec;
      return bErrOk;
    }
    iVar2 = search(handle,pbuf,key,rec,&local_70,MODE_MATCH);
    if (iVar2 < 0) {
      iVar4 = *(ion_bpp_address_t *)(local_70 + -8);
    }
    else {
      iVar4 = *(ion_bpp_address_t *)(local_70 + (long)*(int *)((long)handle + 8) + 8);
    }
    iVar3 = readDisk(handle,iVar4,&local_60);
    if (iVar3 == bErrOk) {
      if (*(uint *)((long)handle + 0xb8) == (uint)(*(ushort *)local_60->p >> 1)) {
        iVar3 = gather(handle,pbuf,&local_70,local_58);
        if ((iVar3 != bErrOk) || (iVar3 = scatter(handle,pbuf,local_70,3,local_58), iVar3 != bErrOk)
           ) {
          bVar1 = false;
          key = local_68;
          local_74 = iVar3;
          goto LAB_00110e28;
        }
        iVar2 = search(handle,pbuf,local_68,rec,&local_70,MODE_MATCH);
        if (iVar2 < 0) {
          iVar4 = *(ion_bpp_address_t *)(local_70 + -8);
        }
        else {
          iVar4 = *(ion_bpp_address_t *)(local_70 + (long)*(int *)((long)handle + 8) + 8);
        }
        iVar3 = readDisk(handle,iVar4,&local_60);
        key = local_68;
        if (iVar3 != bErrOk) goto LAB_00110d5f;
      }
      bVar1 = true;
      pbuf = local_60;
    }
    else {
LAB_00110d5f:
      bVar1 = false;
      local_74 = iVar3;
    }
LAB_00110e28:
    iVar5 = iVar5 + 1;
    if (!bVar1) {
      return local_74;
    }
  } while( true );
}

Assistant:

ion_bpp_err_t
b_update(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	rec
) {
	int					rc;		/* return code */
	ion_bpp_key_t		*mkey;	/* match key */
	int					cc;		/* condition code */
	ion_bpp_buffer_t	*buf, *root;
	ion_bpp_buffer_t	*tmp[4];
	int					height;	/* height of tree */

	ion_bpp_h_node_t *h = handle;

	root = &h->root;

	/* check for full root */
	if (ct(root) == 3 * h->maxCt) {
		/* gather root and scatter to 4 bufs */
		/* this increases b-tree height by 1 */
		if ((rc = gatherRoot(handle)) != 0) {
			return rc;
		}

		if ((rc = scatter(handle, root, fkey(root), 0, tmp)) != 0) {
			return rc;
		}
	}

	buf		= root;
	height	= 0;

	while (1) {
		if (leaf(buf)) {
			/* in leaf, and there' room guaranteed */

			if (height > maxHeight) {
				maxHeight = height;
			}

			/* set mkey to point to update point */
			switch (search(handle, buf, key, rec, &mkey, MODE_MATCH)) {
				case ION_CC_LT:	/* key < mkey */
					return bErrKeyNotFound;
					break;

				case ION_CC_EQ:	/* key = mkey */
					break;

				case ION_CC_GT:	/* key > mkey */
					return bErrKeyNotFound;
					break;
			}

			/* update key */
			rec(mkey) = rec;
			break;
		}
		else {
			/* internal node, descend to child */
			ion_bpp_buffer_t *cbuf;	/* child buf */

			height++;

			/* read child */
			if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
				if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
					return rc;
				}
			}

			/* check for room in child */
			if (ct(cbuf) == h->maxCt) {
				/* gather 3 bufs and scatter */
				if ((rc = gather(handle, buf, &mkey, tmp)) != 0) {
					return rc;
				}

				if ((rc = scatter(handle, buf, mkey, 3, tmp)) != 0) {
					return rc;
				}

				/* read child */
				if ((cc = search(handle, buf, key, rec, &mkey, MODE_MATCH)) < 0) {
					if ((rc = readDisk(handle, childLT(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
				else {
					if ((rc = readDisk(handle, childGE(mkey), &cbuf)) != 0) {
						return rc;
					}
				}
			}

			buf = cbuf;
		}
	}

	return bErrOk;
}